

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::Int64Parameter::SerializeWithCachedSizes
          (Int64Parameter *this,CodedOutputStream *output)

{
  uint32 uVar1;
  
  if (this->defaultvalue_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt64(1,this->defaultvalue_,output);
  }
  uVar1 = this->_oneof_case_[0];
  if (uVar1 == 10) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (10,&((this->AllowedValues_).range_)->super_MessageLite,output);
    uVar1 = this->_oneof_case_[0];
  }
  if (uVar1 == 0xb) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0xb,&((this->AllowedValues_).range_)->super_MessageLite,output);
    return;
  }
  return;
}

Assistant:

void Int64Parameter::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.Int64Parameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // int64 defaultValue = 1;
  if (this->defaultvalue() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(1, this->defaultvalue(), output);
  }

  // .CoreML.Specification.Int64Range range = 10;
  if (has_range()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      10, *AllowedValues_.range_, output);
  }

  // .CoreML.Specification.Int64Set set = 11;
  if (has_set()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      11, *AllowedValues_.set_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.Int64Parameter)
}